

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  Nonnull<const_char_*> pcVar5;
  size_t offset;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pair<unsigned_long,_bool> pVar9;
  
  pbVar1 = this->buffer_;
  pbVar4 = this->buffer_end_;
  if (((int)pbVar4 - (int)pbVar1 < 10) && ((pbVar4 <= pbVar1 || ((char)pbVar4[-1] < '\0')))) {
    pVar9 = ReadVarint64Fallback(this);
    uVar3 = 0xffffffff;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = -(uint)(pVar9.first >> 0x1f != 0) | (uint)pVar9.first;
    }
  }
  else {
    if ((char)*pbVar1 < '\0') {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                         (*pbVar1,0x80,"buffer[0] >= 128");
    }
    if (pcVar5 != (Nonnull<const_char_*>)0x0) {
      ReadVarintSizeAsIntFallback();
    }
    if ((long)(char)pbVar1[1] < 0) {
      if ((long)(char)pbVar1[2] < 0) {
        if ((long)(char)pbVar1[3] < 0) {
          if ((long)(char)pbVar1[4] < 0) {
            if ((long)(char)pbVar1[5] < 0) {
              if ((long)(char)pbVar1[6] < 0) {
                if ((long)(char)pbVar1[7] < 0) {
                  if ((long)(char)pbVar1[8] < 0) {
                    uVar7 = (ulong)(char)pbVar1[9];
                    if ((long)uVar7 < 0) {
                      bVar2 = false;
                      lVar8 = 0xb;
                    }
                    else {
                      uVar7 = uVar7 << 0x3f;
                      lVar6 = 0;
                      lVar8 = 10;
                      pbVar4 = pbVar1;
                      do {
                        uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar6 & 0x3f));
                        lVar6 = lVar6 + 7;
                        pbVar4 = pbVar4 + 1;
                        bVar2 = true;
                      } while (lVar6 != 0x3f);
                    }
                  }
                  else {
                    uVar7 = (long)(char)pbVar1[8] << 0x38;
                    lVar6 = 0;
                    lVar8 = 9;
                    pbVar4 = pbVar1;
                    do {
                      uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar6 & 0x3f));
                      lVar6 = lVar6 + 7;
                      pbVar4 = pbVar4 + 1;
                      bVar2 = true;
                    } while (lVar6 != 0x38);
                  }
                }
                else {
                  uVar7 = (long)(char)pbVar1[7] << 0x31;
                  lVar6 = 0;
                  lVar8 = 8;
                  pbVar4 = pbVar1;
                  do {
                    uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar6 & 0x3f));
                    lVar6 = lVar6 + 7;
                    pbVar4 = pbVar4 + 1;
                    bVar2 = true;
                  } while (lVar6 != 0x31);
                }
              }
              else {
                uVar7 = (long)(char)pbVar1[6] << 0x2a;
                lVar6 = 0;
                lVar8 = 7;
                pbVar4 = pbVar1;
                do {
                  uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar6 & 0x3f));
                  lVar6 = lVar6 + 7;
                  pbVar4 = pbVar4 + 1;
                  bVar2 = true;
                } while (lVar6 != 0x2a);
              }
            }
            else {
              uVar7 = (long)(char)pbVar1[5] << 0x23;
              lVar6 = 0;
              lVar8 = 6;
              pbVar4 = pbVar1;
              do {
                uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar6 & 0x3f));
                lVar6 = lVar6 + 7;
                pbVar4 = pbVar4 + 1;
                bVar2 = true;
              } while (lVar6 != 0x23);
            }
          }
          else {
            uVar7 = (long)(char)pbVar1[4] << 0x1c;
            lVar8 = 0;
            pbVar4 = pbVar1;
            do {
              uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
              pbVar4 = pbVar4 + 1;
            } while (lVar8 != 0x1c);
            bVar2 = true;
            lVar8 = 5;
          }
        }
        else {
          uVar7 = (long)(char)pbVar1[3] << 0x15;
          lVar8 = 0;
          pbVar4 = pbVar1;
          do {
            uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar8 & 0x3f));
            lVar8 = lVar8 + 7;
            pbVar4 = pbVar4 + 1;
          } while (lVar8 != 0x15);
          bVar2 = true;
          lVar8 = 4;
        }
      }
      else {
        uVar7 = (long)(char)pbVar1[2] << 0xe;
        lVar8 = 0;
        pbVar4 = pbVar1;
        do {
          uVar7 = uVar7 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar8 & 0x3f));
          lVar8 = lVar8 + 7;
          pbVar4 = pbVar4 + 1;
        } while (lVar8 == 7);
        bVar2 = true;
        lVar8 = 3;
      }
    }
    else {
      uVar7 = ((long)(char)pbVar1[1] * 0x80 + (ulong)*pbVar1) - 0x80;
      bVar2 = true;
      lVar8 = 2;
    }
    uVar3 = 0xffffffff;
    if ((bVar2) && (uVar7 < 0x80000000)) {
      this->buffer_ = pbVar1 + lVar8;
      uVar3 = (uint)uVar7;
    }
  }
  return uVar3;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64_t>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}